

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O0

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionCodeGenRuntimeData::EnsureInlineeCommon
          (FunctionCodeGenRuntimeData *this,Recycler *recycler,ProfileId profiledCallSiteId,
          FunctionBody *inlinee,Type *codeGenRuntimeData)

{
  code *pcVar1;
  ushort uVar2;
  bool bVar3;
  ProfileId PVar4;
  undefined4 *puVar5;
  FunctionBody *pFVar6;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> **ppWVar7;
  Recycler *pRVar8;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *ptr;
  FunctionCodeGenRuntimeData **ppFVar9;
  FunctionCodeGenRuntimeData *pFVar10;
  TrackAllocData local_f0;
  FunctionCodeGenRuntimeData *local_c8;
  FunctionCodeGenRuntimeData *runtimeData;
  FunctionCodeGenRuntimeData *next;
  undefined8 local_b0;
  TrackAllocData local_a8;
  FunctionCodeGenRuntimeData *local_80;
  FunctionCodeGenRuntimeData *runtimeData_1;
  Type inlineeData;
  TrackAllocData local_60;
  WriteBarrierPtr *local_38;
  Type *codeGenRuntimeData_local;
  FunctionBody *inlinee_local;
  Recycler *pRStack_20;
  ProfileId profiledCallSiteId_local;
  Recycler *recycler_local;
  FunctionCodeGenRuntimeData *this_local;
  
  local_38 = (WriteBarrierPtr *)codeGenRuntimeData;
  codeGenRuntimeData_local = (Type *)inlinee;
  inlinee_local._6_2_ = profiledCallSiteId;
  pRStack_20 = recycler;
  recycler_local = (Recycler *)this;
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x56,"(recycler)","recycler");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar2 = inlinee_local._6_2_;
  pFVar6 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->functionBody);
  PVar4 = FunctionBody::GetProfiledCallSiteCount(pFVar6);
  if (PVar4 <= uVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x57,
                                "(profiledCallSiteId < functionBody->GetProfiledCallSiteCount())",
                                "profiledCallSiteId < functionBody->GetProfiledCallSiteCount()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (codeGenRuntimeData_local == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x58,"(inlinee)","inlinee");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ppWVar7 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__(local_38);
  pRVar8 = pRStack_20;
  if (*ppWVar7 == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    pFVar6 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->functionBody);
    PVar4 = FunctionBody::GetProfiledCallSiteCount(pFVar6);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,
               (type_info *)&Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::typeinfo,0,
               (ulong)PVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
               ,0x5c);
    pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,&local_60);
    pFVar6 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->functionBody);
    PVar4 = FunctionBody::GetProfiledCallSiteCount(pFVar6);
    inlineeData.ptr = (FunctionCodeGenRuntimeData *)Memory::Recycler::AllocZero;
    ptr = Memory::
          AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>,false>
                    ((Memory *)pRVar8,(Recycler *)Memory::Recycler::AllocZero,0,(ulong)PVar4);
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>_>::operator=
              ((WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>_> *)local_38
               ,ptr);
  }
  ppWVar7 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__(local_38);
  Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierPtr
            ((WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)&runtimeData_1,
             *ppWVar7 + inlinee_local._6_2_);
  ppFVar9 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenRuntimeData__
                      ((WriteBarrierPtr *)&runtimeData_1);
  pRVar8 = pRStack_20;
  if (*ppFVar9 == (FunctionCodeGenRuntimeData *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_a8,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
               ,99);
    pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,&local_a8);
    next = (FunctionCodeGenRuntimeData *)Memory::Recycler::AllocInlined;
    local_b0 = 0;
    pFVar10 = (FunctionCodeGenRuntimeData *)new<Memory::Recycler>(0x40,pRVar8,0x43c4b0);
    FunctionCodeGenRuntimeData(pFVar10,(FunctionBody *)codeGenRuntimeData_local);
    local_80 = pFVar10;
    ppWVar7 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__(local_38);
    Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::operator=
              (*ppWVar7 + inlinee_local._6_2_,pFVar10);
    this_local = local_80;
  }
  else {
    ppFVar9 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenRuntimeData__
                        ((WriteBarrierPtr *)&runtimeData_1);
    runtimeData = *ppFVar9;
    while( true ) {
      bVar3 = false;
      if (runtimeData != (FunctionCodeGenRuntimeData *)0x0) {
        pFVar6 = GetFunctionBody(runtimeData);
        bVar3 = pFVar6 != (FunctionBody *)codeGenRuntimeData_local;
      }
      pRVar8 = pRStack_20;
      if (!bVar3) break;
      runtimeData = GetNext(runtimeData);
    }
    if (runtimeData == (FunctionCodeGenRuntimeData *)0x0) {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_f0,(type_info *)&typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                 ,0x75);
      pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,&local_f0);
      pFVar10 = (FunctionCodeGenRuntimeData *)new<Memory::Recycler>(0x40,pRVar8,0x43c4b0);
      FunctionCodeGenRuntimeData(pFVar10,(FunctionBody *)codeGenRuntimeData_local);
      local_c8 = pFVar10;
      ppFVar9 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenRuntimeData__
                          ((WriteBarrierPtr *)&runtimeData_1);
      SetupRuntimeDataChain(pFVar10,*ppFVar9);
      pFVar10 = local_c8;
      ppWVar7 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__(local_38);
      Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::operator=
                (*ppWVar7 + inlinee_local._6_2_,pFVar10);
      this_local = local_c8;
    }
    else {
      this_local = runtimeData;
    }
  }
  return this_local;
}

Assistant:

FunctionCodeGenRuntimeData * FunctionCodeGenRuntimeData::EnsureInlineeCommon(
        Recycler *const recycler,
        const ProfileId profiledCallSiteId,
        FunctionBody *const inlinee,
        Field(Field(FunctionCodeGenRuntimeData *)*) & codeGenRuntimeData)
    {
        Assert(recycler);
        Assert(profiledCallSiteId < functionBody->GetProfiledCallSiteCount());
        Assert(inlinee);

        if (codeGenRuntimeData == nullptr)
        {
            codeGenRuntimeData = RecyclerNewArrayZ(recycler, Field(FunctionCodeGenRuntimeData *), functionBody->GetProfiledCallSiteCount());
        }

        Field(FunctionCodeGenRuntimeData *) const inlineeData = codeGenRuntimeData[profiledCallSiteId];

        if (inlineeData == nullptr)
        {
            FunctionCodeGenRuntimeData * runtimeData = RecyclerNew(recycler, FunctionCodeGenRuntimeData, inlinee);
            codeGenRuntimeData[profiledCallSiteId] = runtimeData;
            return runtimeData;
        }

        // Find the right code gen runtime data
        FunctionCodeGenRuntimeData * next = inlineeData;

        while (next && (next->GetFunctionBody() != inlinee))
        {
            next = next->GetNext();
        }

        if (next)
        {
            return next;
        }

        FunctionCodeGenRuntimeData * runtimeData = RecyclerNew(recycler, FunctionCodeGenRuntimeData, inlinee);
        runtimeData->SetupRuntimeDataChain(inlineeData);
        codeGenRuntimeData[profiledCallSiteId] = runtimeData;
        return runtimeData;
    }